

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_replaceRangeCString_success_nullptrReplaceArray_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 8;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x136c44;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"012xxx34",9);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x136c8f;
  bVar1 = AString_replaceRangeCString(&string,0x29a,0x2a,(char *)0x0,3);
  if (bVar1 == false) {
    pcVar4 = "Assertion \'AString_replaceRangeCString(&string, 666, 42, ((void*)0), 3)\' failed";
    iVar2 = 0x5e0;
LAB_00137436:
    uStack_50 = 0x137442;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,pcVar4,0,0);
  }
  uStack_50 = 0x136ca8;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5e0);
  if (string.capacity != 8) {
    local_60 = "(8)";
    pcVar5 = "(string).capacity == (8)";
    pcVar8 = "(string).capacity";
    pcVar4 = (char *)string.capacity;
LAB_00137116:
    iVar2 = 0x5e1;
    goto LAB_00137471;
  }
  uStack_50 = 0x136cc8;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5e1);
  if (string.buffer == (char *)0x0) {
    ppcVar7 = &local_58;
    pcVar5 = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar8 = "(void*) (string).buffer != NULL";
    pcVar9 = "(void*) (string).buffer";
    iVar2 = 0x5e1;
    goto LAB_0013759c;
  }
  uStack_50 = 0x136ce5;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5e1);
  pcVar9 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar4 = "";
    pcVar9 = "(null)";
LAB_001370aa:
    local_60 = "012xxx34";
    pcStack_70 = "(\"012xxx34\")";
    pcVar5 = "(string).buffer == (\"012xxx34\")";
    iVar2 = 0x5e1;
  }
  else {
    uStack_50 = 0x136d02;
    iVar2 = strcmp("012xxx34",string.buffer);
    if (iVar2 != 0) {
      pcVar4 = "\"";
      goto LAB_001370aa;
    }
    uStack_50 = 0x136d1b;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x5e1);
    if (string.size != 8) {
      local_60 = "strlen(\"012xxx34\")";
      pcVar5 = "(string).size == strlen(\"012xxx34\")";
      pcVar8 = "(string).size";
      pcVar4 = (char *)string.size;
      goto LAB_00137116;
    }
    uStack_50 = 0x136d3b;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x5e1);
    if (private_ACUtilsTest_AString_reallocCount != 0) {
      ppcVar7 = &local_68;
      local_60 = "(0)";
      local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
      pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
      pcVar9 = "private_ACUtilsTest_AString_reallocCount";
      iVar2 = 0x5e2;
LAB_0013759c:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) =
           test_AString_replaceRangeCString_success_smallerReplaceLength_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_50 = 0x136d5c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x5e2);
    uStack_50 = 0x136d76;
    bVar1 = AString_replaceRangeCString(&string,3,3,(char *)0x0,3);
    if (bVar1 == false) {
      pcVar4 = "Assertion \'AString_replaceRangeCString(&string, 3, 3, ((void*)0), 3)\' failed";
      iVar2 = 0x5e3;
      goto LAB_00137436;
    }
    uStack_50 = 0x136d8f;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x5e3);
    if (string.capacity != 8) {
      local_60 = "(8)";
      pcVar5 = "(string).capacity == (8)";
      pcVar8 = "(string).capacity";
      iVar2 = 0x5e4;
      pcVar4 = (char *)string.capacity;
      goto LAB_00137471;
    }
    uStack_50 = 0x136daf;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x5e4);
    if (string.buffer == (char *)0x0) {
      ppcVar7 = &local_58;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (string).buffer != NULL";
      pcVar9 = "(void*) (string).buffer";
      iVar2 = 0x5e4;
      goto LAB_0013759c;
    }
    uStack_50 = 0x136dcc;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x5e4);
    pcVar9 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar4 = "";
      pcVar9 = "(null)";
LAB_001371fd:
      local_60 = "01234";
      pcStack_70 = "(\"01234\")";
      pcVar5 = "(string).buffer == (\"01234\")";
      iVar2 = 0x5e4;
    }
    else {
      uStack_50 = 0x136de9;
      iVar2 = strcmp("01234",string.buffer);
      if (iVar2 != 0) {
        pcVar4 = "\"";
        goto LAB_001371fd;
      }
      uStack_50 = 0x136e02;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x5e4);
      if (string.size != 5) {
        local_60 = "strlen(\"01234\")";
        pcVar5 = "(string).size == strlen(\"01234\")";
        pcVar8 = "(string).size";
        iVar2 = 0x5e4;
        local_58 = (char *)0x5;
        pcVar4 = (char *)string.size;
LAB_00137477:
        expr = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        ppcVar6 = &local_60;
        goto LAB_00137479;
      }
      uStack_50 = 0x136e22;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x5e4);
      if (private_ACUtilsTest_AString_reallocCount != 0) {
        ppcVar7 = &local_68;
        local_60 = "(0)";
        local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
        pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
        pcVar9 = "private_ACUtilsTest_AString_reallocCount";
        iVar2 = 0x5e5;
        goto LAB_0013759c;
      }
      uStack_50 = 0x136e43;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x5e5);
      uStack_50 = 0x136e5d;
      bVar1 = AString_replaceRangeCString(&string,3,0x29a,(char *)0x0,3);
      if (bVar1 == false) {
        pcVar4 = "Assertion \'AString_replaceRangeCString(&string, 3, 666, ((void*)0), 3)\' failed";
        iVar2 = 0x5e6;
        goto LAB_00137436;
      }
      uStack_50 = 0x136e76;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x5e6);
      if (string.capacity != 8) {
        local_60 = "(8)";
        pcVar5 = "(string).capacity == (8)";
        pcVar8 = "(string).capacity";
        iVar2 = 0x5e7;
        pcVar4 = (char *)string.capacity;
LAB_00137471:
        local_58 = (char *)0x8;
        goto LAB_00137477;
      }
      uStack_50 = 0x136e96;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x5e7);
      if (string.buffer == (char *)0x0) {
        ppcVar7 = &local_58;
        pcVar5 = "Assertion \'_ck_x != NULL\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %#x";
        pcVar8 = "(void*) (string).buffer != NULL";
        pcVar9 = "(void*) (string).buffer";
        iVar2 = 0x5e7;
        goto LAB_0013759c;
      }
      uStack_50 = 0x136eb3;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x5e7);
      pcVar9 = string.buffer;
      if (string.buffer == (char *)0x0) {
        pcVar4 = "";
        pcVar9 = "(null)";
      }
      else {
        uStack_50 = 0x136ed0;
        iVar2 = strcmp("012",string.buffer);
        if (iVar2 == 0) {
          uStack_50 = 0x136ee9;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x5e7);
          if (string.size != 3) {
            local_60 = "strlen(\"012\")";
            pcVar5 = "(string).size == strlen(\"012\")";
            pcVar8 = "(string).size";
            iVar2 = 0x5e7;
            local_58 = (char *)0x3;
            pcVar4 = (char *)string.size;
            goto LAB_00137477;
          }
          uStack_50 = 0x136f09;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x5e7);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            ppcVar7 = &local_68;
            local_60 = "(0)";
            local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
            pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar9 = "private_ACUtilsTest_AString_reallocCount";
            iVar2 = 0x5e8;
            goto LAB_0013759c;
          }
          uStack_50 = 0x136f2a;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x5e8);
          uStack_50 = 0x136f41;
          bVar1 = AString_replaceRangeCString(&string,0,4,(char *)0x0,3);
          if (bVar1 == false) {
            pcVar4 = 
            "Assertion \'AString_replaceRangeCString(&string, 0, 4, ((void*)0), 3)\' failed";
            iVar2 = 0x5e9;
            goto LAB_00137436;
          }
          uStack_50 = 0x136f5a;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x5e9);
          if (string.capacity == 8) {
            uStack_50 = 0x136f7a;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x5ea);
            if (string.buffer == (char *)0x0) {
              ppcVar7 = &local_58;
              pcVar5 = "Assertion \'_ck_x != NULL\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
              pcVar8 = "(void*) (string).buffer != NULL";
              pcVar9 = "(void*) (string).buffer";
            }
            else {
              uStack_50 = 0x136f97;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x5ea);
              if (string.buffer == (char *)0x0) {
                pcStack_80 = "(null)";
                pcStack_78 = "";
LAB_001374c6:
                uStack_50 = 0;
                local_58 = "\"";
                local_60 = "";
                local_68 = "\"";
                pcStack_70 = "(\"\")";
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x5ea,
                                  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                  ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                  "(string).buffer == (\"\")","(string).buffer",pcStack_78);
              }
              if (*string.buffer != '\0') {
                pcStack_78 = "\"";
                pcStack_80 = string.buffer;
                goto LAB_001374c6;
              }
              uStack_50 = 0x136fc7;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x5ea);
              if (string.size == 0) {
                uStack_50 = 0x136fe6;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x5ea);
                if (private_ACUtilsTest_AString_reallocCount == 0) {
                  uStack_50 = 0x137007;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x5eb);
                  uStack_50 = 0x137010;
                  (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))
                            (string.buffer);
                  return;
                }
                ppcVar7 = &local_68;
                local_60 = "(0)";
                local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
                pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
                pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
                pcVar9 = "private_ACUtilsTest_AString_reallocCount";
                iVar2 = 0x5eb;
                goto LAB_0013759c;
              }
              ppcVar7 = &local_68;
              local_60 = "strlen(\"\")";
              local_68 = (char *)string.size;
              pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar8 = "(string).size == strlen(\"\")";
              pcVar9 = "(string).size";
            }
            iVar2 = 0x5ea;
            goto LAB_0013759c;
          }
          local_60 = "(8)";
          pcVar5 = "(string).capacity == (8)";
          pcVar8 = "(string).capacity";
          iVar2 = 0x5ea;
          pcVar4 = (char *)string.capacity;
          goto LAB_00137471;
        }
        pcVar4 = "\"";
      }
      local_60 = "012";
      pcStack_70 = "(\"012\")";
      pcVar5 = "(string).buffer == (\"012\")";
      iVar2 = 0x5e7;
    }
  }
  pcVar8 = "(string).buffer";
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  local_68 = "\"";
  ppcVar6 = &pcStack_80;
  pcStack_80 = pcVar9;
  pcStack_78 = pcVar4;
LAB_00137479:
  uStack_50 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar4;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x137480;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar5,pcVar8);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceRangeCString_success_nullptrReplaceArray)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("012xxx34", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_replaceRangeCString(&string, 666, 42, nullptr, 3));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012xxx34", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_replaceRangeCString(&string, 3, 3, nullptr, 3));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_replaceRangeCString(&string, 3, 666, nullptr, 3));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_replaceRangeCString(&string, 0, 4, nullptr, 3));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}